

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O2

int Io_ReadBlifReorderFormalNames(Vec_Ptr_t *vTokens,Mio_Gate_t *pGate,Mio_Gate_t *pTwin)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Mio_Pin_t *pMVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  void *pvVar8;
  int iVar9;
  long lVar10;
  
  iVar2 = vTokens->nSize;
  iVar9 = iVar2 + -3;
  iVar1 = Mio_GateReadPinNum(pGate);
  if (pTwin != (Mio_Gate_t *)0x0) {
    if (iVar9 == iVar1) goto LAB_0069eb30;
    iVar9 = iVar2 + -4;
    iVar1 = Mio_GateReadPinNum(pGate);
  }
  if (iVar9 != iVar1) {
    return 0;
  }
LAB_0069eb30:
  pMVar4 = Mio_GateReadPins(pGate);
  iVar1 = 2;
  while (pMVar4 != (Mio_Pin_t *)0x0) {
    pcVar5 = Mio_PinReadName(pMVar4);
    sVar6 = strlen(pcVar5);
    pcVar7 = (char *)Vec_PtrEntry(vTokens,iVar1);
    iVar9 = strncmp(pcVar5,pcVar7,(long)(int)sVar6);
    if ((iVar9 != 0) || (pcVar7[(int)sVar6] != '=')) break;
    pMVar4 = Mio_PinReadNext(pMVar4);
    iVar1 = iVar1 + 1;
  }
  iVar9 = Mio_GateReadPinNum(pGate);
  if (pTwin == (Mio_Gate_t *)0x0) {
    if (iVar1 - iVar9 == 2) {
      return 1;
    }
    for (pMVar4 = Mio_GateReadPins(pGate); pMVar4 != (Mio_Pin_t *)0x0;
        pMVar4 = Mio_PinReadNext(pMVar4)) {
      pcVar5 = Mio_PinReadName(pMVar4);
      sVar6 = strlen(pcVar5);
      for (iVar1 = 2; iVar1 < iVar2; iVar1 = iVar1 + 1) {
        pcVar7 = (char *)Vec_PtrEntry(vTokens,iVar1);
        iVar9 = strncmp(pcVar5,pcVar7,(long)(int)sVar6);
        if ((iVar9 == 0) && (pcVar7[(int)sVar6] == '=')) {
          Vec_PtrPush(vTokens,pcVar7);
          break;
        }
      }
    }
    pcVar5 = Mio_GateReadOutName(pGate);
    sVar6 = strlen(pcVar5);
    for (iVar1 = 2; iVar1 < iVar2; iVar1 = iVar1 + 1) {
      pcVar7 = (char *)Vec_PtrEntry(vTokens,iVar1);
      iVar9 = strncmp(pcVar5,pcVar7,(long)(int)sVar6);
      if ((iVar9 == 0) && (pcVar7[(int)sVar6] == '=')) {
        Vec_PtrPush(vTokens,pcVar7);
        break;
      }
    }
    iVar1 = vTokens->nSize;
    if (iVar1 - iVar2 != iVar2 + -2) {
      return 0;
    }
    lVar10 = 0;
    while( true ) {
      iVar9 = (int)lVar10;
      if (iVar1 <= iVar2 + iVar9) break;
      pvVar8 = Vec_PtrEntry(vTokens,iVar2 + iVar9);
      if ((iVar9 < -2) || (iVar1 = vTokens->nSize, iVar1 <= iVar9 + 2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      vTokens->pArray[lVar10 + 2] = pvVar8;
      lVar10 = lVar10 + 1;
    }
    if (iVar1 < iVar2) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                    ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
    }
    vTokens->nSize = iVar2;
  }
  else {
    if (iVar1 - iVar9 != 2) {
      return 0;
    }
    iVar1 = Mio_GateReadPinNum(pGate);
    if (iVar2 + -3 != iVar1) {
      iVar1 = Mio_GateReadPinNum(pGate);
      if (iVar2 + -4 != iVar1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioReadBlif.c"
                      ,0x295,
                      "int Io_ReadBlifReorderFormalNames(Vec_Ptr_t *, Mio_Gate_t *, Mio_Gate_t *)");
      }
      pcVar5 = Mio_GateReadOutName(pGate);
      sVar6 = strlen(pcVar5);
      pcVar7 = (char *)Vec_PtrEntry(vTokens,iVar2 + -2);
      iVar1 = strncmp(pcVar5,pcVar7,(long)(int)sVar6);
      if ((iVar1 == 0) && (pcVar7[(int)sVar6] == '=')) {
        pcVar5 = Mio_GateReadOutName(pTwin);
        sVar6 = strlen(pcVar5);
        pcVar7 = (char *)Vec_PtrEntry(vTokens,iVar2 + -1);
        iVar2 = strncmp(pcVar5,pcVar7,(long)(int)sVar6);
        if (iVar2 == 0) {
          return (uint)(pcVar7[(int)sVar6] == '=');
        }
        return 0;
      }
      return 0;
    }
    pcVar5 = Mio_GateReadOutName(pGate);
    sVar6 = strlen(pcVar5);
    pcVar7 = (char *)Vec_PtrEntry(vTokens,iVar2 + -1);
    iVar1 = strncmp(pcVar5,pcVar7,(long)(int)sVar6);
    if ((iVar1 == 0) && (pcVar7[(int)sVar6] == '=')) {
      pvVar8 = (void *)0x0;
    }
    else {
      pcVar5 = Mio_GateReadOutName(pTwin);
      sVar6 = strlen(pcVar5);
      pcVar7 = (char *)Vec_PtrEntry(vTokens,iVar2 + -1);
      iVar2 = strncmp(pcVar5,pcVar7,(long)(int)sVar6);
      if (iVar2 != 0) {
        return 0;
      }
      if (pcVar7[(int)sVar6] != '=') {
        return 0;
      }
      if (vTokens->nSize < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
      }
      uVar3 = vTokens->nSize - 1;
      vTokens->nSize = uVar3;
      pvVar8 = vTokens->pArray[uVar3];
      Vec_PtrPush(vTokens,(void *)0x0);
    }
    Vec_PtrPush(vTokens,pvVar8);
  }
  return 1;
}

Assistant:

int Io_ReadBlifReorderFormalNames( Vec_Ptr_t * vTokens, Mio_Gate_t * pGate, Mio_Gate_t * pTwin )
{
    Mio_Pin_t * pGatePin;
    char * pName, * pNamePin;
    int i, k, nSize, Length;
    nSize = Vec_PtrSize(vTokens);
    if ( pTwin == NULL )
    {
        if ( nSize - 3 != Mio_GateReadPinNum(pGate) )
            return 0;
    }
    else
    {
        if ( nSize - 3 != Mio_GateReadPinNum(pGate) && nSize - 4 != Mio_GateReadPinNum(pGate) )
            return 0;
    }
    // check if the names are in order
    for ( pGatePin = Mio_GateReadPins(pGate), i = 0; pGatePin; pGatePin = Mio_PinReadNext(pGatePin), i++ )
    {
        pNamePin = Mio_PinReadName(pGatePin);
        Length = strlen(pNamePin);
        pName = (char *)Vec_PtrEntry(vTokens, i+2);
        if ( !strncmp( pNamePin, pName, Length ) && pName[Length] == '=' )
            continue;
        break;
    }
    if ( pTwin == NULL )
    {
        if ( i == Mio_GateReadPinNum(pGate) )
            return 1;
        // reorder the pins
        for ( pGatePin = Mio_GateReadPins(pGate), i = 0; pGatePin; pGatePin = Mio_PinReadNext(pGatePin), i++ )
        {
            pNamePin = Mio_PinReadName(pGatePin);
            Length = strlen(pNamePin);
            for ( k = 2; k < nSize; k++ )
            {
                pName = (char *)Vec_PtrEntry(vTokens, k);
                if ( !strncmp( pNamePin, pName, Length ) && pName[Length] == '=' )
                {
                    Vec_PtrPush( vTokens, pName );
                    break;
                }
            }
        }
        pNamePin = Mio_GateReadOutName(pGate);
        Length = strlen(pNamePin);
        for ( k = 2; k < nSize; k++ )
        {
            pName = (char *)Vec_PtrEntry(vTokens, k);
            if ( !strncmp( pNamePin, pName, Length ) && pName[Length] == '=' )
            {
                Vec_PtrPush( vTokens, pName );
                break;
            }
        }
        if ( Vec_PtrSize(vTokens) - nSize != nSize - 2 )
            return 0;
        Vec_PtrForEachEntryStart( char *, vTokens, pName, k, nSize )
            Vec_PtrWriteEntry( vTokens, k - nSize + 2, pName );
        Vec_PtrShrink( vTokens, nSize );
    }
    else
    {
        if ( i != Mio_GateReadPinNum(pGate) ) // expect the correct order of input pins in the network with twin gates
            return 0;
        // check the last two entries
        if ( nSize - 3 == Mio_GateReadPinNum(pGate) ) // only one output is available
        {
            pNamePin = Mio_GateReadOutName(pGate);
            Length = strlen(pNamePin);
            pName = (char *)Vec_PtrEntry(vTokens, nSize - 1);
            if ( !strncmp( pNamePin, pName, Length ) && pName[Length] == '=' ) // the last entry is pGate
            {
                Vec_PtrPush( vTokens, NULL );
                return 1;
            }
            pNamePin = Mio_GateReadOutName(pTwin);
            Length = strlen(pNamePin);
            pName = (char *)Vec_PtrEntry(vTokens, nSize - 1);
            if ( !strncmp( pNamePin, pName, Length ) && pName[Length] == '=' ) // the last entry is pTwin
            {
                pName = (char *)Vec_PtrPop( vTokens );
                Vec_PtrPush( vTokens, NULL );
                Vec_PtrPush( vTokens, pName );
                return 1;
            }
            return 0;
        }
        if ( nSize - 4 == Mio_GateReadPinNum(pGate) ) // two outputs are available
        {
            pNamePin = Mio_GateReadOutName(pGate);
            Length = strlen(pNamePin);
            pName = (char *)Vec_PtrEntry(vTokens, nSize - 2);
            if ( !(!strncmp( pNamePin, pName, Length ) && pName[Length] == '=') )
                return 0;
            pNamePin = Mio_GateReadOutName(pTwin);
            Length = strlen(pNamePin);
            pName = (char *)Vec_PtrEntry(vTokens, nSize - 1);
            if ( !(!strncmp( pNamePin, pName, Length ) && pName[Length] == '=') )
                return 0;
            return 1;
        }
        assert( 0 );
    }
    return 1;
}